

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenu.cpp
# Opt level: O3

FOptionMenuItem * __thiscall FOptionMenuDescriptor::GetItem(FOptionMenuDescriptor *this,FName *name)

{
  FOptionMenuItem *pFVar1;
  ulong uVar2;
  FName nm;
  int local_2c;
  
  if ((this->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count != 0) {
    uVar2 = 0;
    do {
      pFVar1 = (this->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar2];
      (*(pFVar1->super_FListMenuItem)._vptr_FListMenuItem[7])(&local_2c,pFVar1,0);
      if (local_2c == name->Index) {
        return (this->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar2];
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < (this->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count);
  }
  return (FOptionMenuItem *)0x0;
}

Assistant:

FOptionMenuItem *FOptionMenuDescriptor::GetItem(FName name)
{
	for(unsigned i=0;i<mItems.Size(); i++)
	{
		FName nm = mItems[i]->GetAction(NULL);
		if (nm == name) return mItems[i];
	}
	return NULL;
}